

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

xml_document * xml_parse_document(uint8_t *buffer,size_t length)

{
  xml_node *pxVar1;
  xml_document *document;
  xml_node *root;
  xml_parser parser;
  size_t length_local;
  uint8_t *buffer_local;
  
  parser.buffer = (uint8_t *)0x0;
  root = (xml_node *)buffer;
  parser.position = length;
  parser.length = length;
  if (length == 0) {
    xml_parser_error((xml_parser *)&root,NO_CHARACTER,"xml_parse_document::length equals zero");
    buffer_local = (uint8_t *)0x0;
  }
  else {
    pxVar1 = xml_parse_node((xml_parser *)&root);
    if (pxVar1 == (xml_node *)0x0) {
      xml_parser_error((xml_parser *)&root,NO_CHARACTER,
                       "xml_parse_document::parsing document failed");
      buffer_local = (uint8_t *)0x0;
    }
    else {
      buffer_local = (uint8_t *)malloc(0x18);
      *(uint8_t **)buffer_local = buffer;
      *(size_t *)(buffer_local + 8) = parser.length;
      *(xml_node **)(buffer_local + 0x10) = pxVar1;
    }
  }
  return (xml_document *)buffer_local;
}

Assistant:

struct xml_document* xml_parse_document(uint8_t* buffer, size_t length) {

	/* Initialize parser
	 */
	struct xml_parser parser = {
		.buffer = buffer,
		.position = 0,
		.length = length
	};

	/* An empty buffer can never contain a valid document
	 */
	if (!length) {
		xml_parser_error(&parser, NO_CHARACTER, "xml_parse_document::length equals zero");
		return 0;
	}

	/* Parse the root node
	 */
	struct xml_node* root = xml_parse_node(&parser);
	if (!root) {
		xml_parser_error(&parser, NO_CHARACTER, "xml_parse_document::parsing document failed");
		return 0;
	}

	/* Return parsed document
	 */
	struct xml_document* document = malloc(sizeof(struct xml_document));
	document->buffer.buffer = buffer;
	document->buffer.length = length;
	document->root = root;

	return document;
}